

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O1

string * __thiscall
cmGeneratorExpressionInterpreter::Evaluate
          (cmGeneratorExpressionInterpreter *this,string *expression,string *property)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *target;
  pointer pcVar2;
  cmGeneratorExpressionDAGChecker *__p;
  int iVar3;
  string *psVar4;
  cmGeneratorExpressionDAGChecker dagChecker;
  string local_f0;
  size_type *local_d0;
  size_type local_c8;
  size_type local_c0;
  undefined8 uStack_b8;
  cmGeneratorExpressionDAGChecker local_b0;
  
  local_d0 = (size_type *)(expression->_M_dataplus)._M_p;
  paVar1 = &expression->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0 == paVar1) {
    local_c0 = paVar1->_M_allocated_capacity;
    uStack_b8 = *(undefined8 *)((long)&expression->field_2 + 8);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = paVar1->_M_allocated_capacity;
  }
  local_c8 = expression->_M_string_length;
  (expression->_M_dataplus)._M_p = (pointer)paVar1;
  expression->_M_string_length = 0;
  (expression->field_2)._M_local_buf[0] = '\0';
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_b0,(string *)this);
  __p = local_b0.Parent;
  local_b0.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
  std::
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ::reset((__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           *)&this->CompiledGeneratorExpression,(pointer)__p);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_b0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  target = this->HeadTarget;
  iVar3 = std::__cxx11::string::compare((char *)property);
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  if (iVar3 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"COMPILE_OPTIONS","");
  }
  else {
    pcVar2 = (property->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + property->_M_string_length);
  }
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&local_b0,target,&local_f0,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  psVar4 = cmCompiledGeneratorExpression::Evaluate
                     ((this->CompiledGeneratorExpression)._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                      this->LocalGenerator,&this->Config,this->HeadTarget,&local_b0,
                      (cmGeneratorTarget *)0x0,&this->Language);
  if (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_b0.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.Property._M_dataplus._M_p != &local_b0.Property.field_2) {
    operator_delete(local_b0.Property._M_dataplus._M_p,
                    local_b0.Property.field_2._M_allocated_capacity + 1);
  }
  return psVar4;
}

Assistant:

const std::string& cmGeneratorExpressionInterpreter::Evaluate(
  std::string expression, const std::string& property)
{
  this->CompiledGeneratorExpression =
    this->GeneratorExpression.Parse(std::move(expression));

  // Specify COMPILE_OPTIONS to DAGchecker, same semantic as COMPILE_FLAGS
  cmGeneratorExpressionDAGChecker dagChecker(
    this->HeadTarget,
    property == "COMPILE_FLAGS" ? "COMPILE_OPTIONS" : property, nullptr,
    nullptr);

  return this->CompiledGeneratorExpression->Evaluate(
    this->LocalGenerator, this->Config, this->HeadTarget, &dagChecker, nullptr,
    this->Language);
}